

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::ListAllTypesForServices
               (FileDescriptor *fd,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *types)

{
  int iVar1;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *pvVar2;
  int iVar3;
  Descriptor *local_48;
  Descriptor *local_40;
  MethodDescriptor *local_38;
  MethodDescriptor *method;
  ServiceDescriptor *pSStack_28;
  int j;
  ServiceDescriptor *sd;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *pvStack_18;
  int i;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *types_local;
  FileDescriptor *fd_local;
  
  sd._4_4_ = 0;
  pvStack_18 = types;
  types_local = (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)fd;
  while( true ) {
    iVar1 = sd._4_4_;
    iVar3 = FileDescriptor::service_count((FileDescriptor *)types_local);
    if (iVar3 <= iVar1) break;
    pSStack_28 = FileDescriptor::service((FileDescriptor *)types_local,sd._4_4_);
    method._4_4_ = 0;
    while( true ) {
      iVar1 = method._4_4_;
      iVar3 = ServiceDescriptor::method_count(pSStack_28);
      if (iVar3 <= iVar1) break;
      local_38 = ServiceDescriptor::method(pSStack_28,method._4_4_);
      pvVar2 = pvStack_18;
      local_40 = MethodDescriptor::input_type(local_38);
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back(pvVar2,&local_40);
      pvVar2 = pvStack_18;
      local_48 = MethodDescriptor::output_type(local_38);
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back(pvVar2,&local_48);
      method._4_4_ = method._4_4_ + 1;
    }
    sd._4_4_ = sd._4_4_ + 1;
  }
  return;
}

Assistant:

void ListAllTypesForServices(const FileDescriptor* fd,
                             std::vector<const Descriptor*>* types) {
  for (int i = 0; i < fd->service_count(); i++) {
    const ServiceDescriptor* sd = fd->service(i);
    for (int j = 0; j < sd->method_count(); j++) {
      const MethodDescriptor* method = sd->method(j);
      types->push_back(method->input_type());
      types->push_back(method->output_type());
    }
  }
}